

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-overlay-page.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  QPDFPageObjectHelper QVar3;
  long *plVar4;
  ostream *poVar5;
  char *pcVar6;
  long in_RCX;
  QPDFMatrix *pQVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  undefined1 auVar12 [12];
  QPDF inpdf;
  QPDF stamppdf;
  QPDFMatrix m;
  int min_suffix;
  QPDFObjectHandle stamp_fo;
  QPDFObjectHandle foreign_fo;
  QPDFPageObjectHelper stamp_page_1;
  string content;
  string name;
  QPDFObjectHandle resources;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar22;
  undefined1 in_stack_fffffffffffffdd4 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  QPDF local_200 [8];
  long *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  long local_1e8;
  undefined2 local_1e0;
  undefined1 local_1de;
  undefined4 local_1c4;
  undefined8 local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  undefined1 local_1b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  long local_190;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  undefined8 local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined8 local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  undefined8 local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined **local_148;
  long local_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long local_128;
  element_type *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  QPDFObjectHandle local_f0;
  long local_e0 [2];
  char *local_d0;
  QPDFMatrix *local_c8;
  code *local_c0;
  QPDFMatrix *local_b8;
  QPDFMatrix *local_b0;
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 4) {
    pcVar6 = argv[1];
    pcVar1 = argv[2];
    pcVar2 = argv[3];
    QPDF::QPDF((QPDF *)&stack0xfffffffffffffdd8);
    QPDF::processFile(&stack0xfffffffffffffdd8,pcVar6);
    QPDF::QPDF(local_200);
    QPDF::processFile((char *)local_200,pcVar1);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1b0,local_200);
    QPDFPageDocumentHelper::getAllPages();
    in_RCX = (long)local_1f0 - (long)local_1f8;
    if (in_RCX != 0) {
      local_140 = local_1f8[1];
      local_138 = (element_type *)local_1f8[2];
      if (local_138 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_138 + 8) = *(int *)(local_138 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_138 + 8) = *(int *)(local_138 + 8) + 1;
        }
      }
      local_c0 = QPDFWriter::write;
      local_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8[3];
      local_128 = local_1f8[4];
      if (local_128 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_128 + 8) = *(int *)(local_128 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_128 + 8) = *(int *)(local_128 + 8) + 1;
        }
      }
      local_148 = &PTR__QPDFPageObjectHelper_00105d28;
      local_120 = (element_type *)local_1f8[5];
      local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8[6];
      if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_118._M_pi + 8) = *(int *)(local_118._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_118._M_pi + 8) = *(int *)(local_118._M_pi + 8) + 1;
        }
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_1f8);
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1b0);
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&local_158,0));
      local_168 = local_158;
      local_160 = local_150;
      if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_150 + 8) = *(int *)(local_150 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_150 + 8) = *(int *)(local_150 + 8) + 1;
        }
      }
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffdd8;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_1c0;
      QPDF::copyForeignObject(QVar8);
      if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
      }
      local_d0 = pcVar2;
      QPDFPageDocumentHelper::QPDFPageDocumentHelper
                ((QPDFPageDocumentHelper *)local_1b0,(QPDF *)&stack0xfffffffffffffdd8);
      QPDFPageDocumentHelper::getAllPages();
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1b0);
      local_c8 = local_b0;
      if (local_b8 != local_b0) {
        pQVar7 = local_b8;
        do {
          local_1e8 = 0x6372756f7365522f;
          local_1e0 = 0x7365;
          local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
          local_1de = 0;
          local_1f8 = &local_1e8;
          QPDFPageObjectHelper::getAttribute(local_60,SUB81(pQVar7,0));
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          local_1c4 = 1;
          local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
          local_1e8 = CONCAT44(local_1e8._4_4_,0x78462f);
          local_1f8 = &local_1e8;
          QPDFObjectHandle::getUniqueResourceName
                    ((string *)&local_f0,(int *)local_60,(set *)&local_1f8);
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)&local_1f8);
          local_178 = local_1c0;
          local_170 = local_1b8;
          if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_1b8 + 8) = *(int *)(local_1b8 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_1b8 + 8) = *(int *)(local_1b8 + 8) + 1;
            }
          }
          QPDFPageObjectHelper::getTrimBox(SUB81(&local_220,0),SUB81(pQVar7,0));
          QPDFObjectHandle::getArrayAsRectangle();
          uVar22 = 0;
          uVar21 = 1;
          uVar13 = local_50;
          uVar14 = uStack_4c;
          uVar15 = uStack_48;
          uVar16 = uStack_44;
          uVar17 = local_40;
          uVar18 = uStack_3c;
          uVar19 = uStack_38;
          uVar20 = uStack_34;
          QPDFPageObjectHelper::placeFormXObject
                    (&local_110,pQVar7,&local_178,&local_f0,(QPDFMatrix *)&local_1f8,1);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_string_length);
          }
          if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
          }
          if (local_110._M_string_length != 0) {
            operator____qpdf((char *)local_70,0x104079);
            QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
            QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_60;
            QPDFObjectHandle::mergeResources(QVar9,(map *)0x0);
            if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
            }
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            local_220.field_2._M_allocated_capacity = 0x7463656a624f582f;
            local_220._M_string_length = 8;
            local_220.field_2._M_local_buf[8] = '\0';
            QPDFObjectHandle::getKey(local_80);
            QPDFObjectHandle::replaceKey(local_80,&local_f0);
            if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            local_220._M_string_length = 2;
            local_220.field_2._M_allocated_capacity._0_3_ = 0xa71;
            QPDF::newStream((string *)local_90);
            QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90;
            QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)pQVar7;
            QPDFPageObjectHelper::addPageContents(QVar10,true);
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_220,"\nQ\n",&local_110);
            QPDF::newStream((string *)local_a0);
            QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0;
            QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)pQVar7;
            QPDFPageObjectHelper::addPageContents(QVar11,false);
            if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_1b0._8_8_ = local_140;
          local_1b0._16_8_ = local_138;
          if (local_138 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_138 + 8) = *(int *)(local_138 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_138 + 8) = *(int *)(local_138 + 8) + 1;
            }
          }
          local_198._M_pi = local_130;
          local_190 = local_128;
          if (local_128 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_128 + 8) = *(int *)(local_128 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_128 + 8) = *(int *)(local_128 + 8) + 1;
            }
          }
          local_1b0._0_8_ = &PTR__QPDFPageObjectHelper_00105d28;
          local_188 = local_120;
          local_180._M_pi = local_118._M_pi;
          if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_118._M_pi + 8) = *(int *)(local_118._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_118._M_pi + 8) = *(int *)(local_118._M_pi + 8) + 1;
            }
          }
          QVar3._4_4_ = uVar14;
          QVar3._0_4_ = uVar13;
          QVar3._8_4_ = uVar15;
          QVar3._12_4_ = uVar16;
          QVar3._16_4_ = uVar17;
          QVar3._20_4_ = uVar18;
          QVar3._24_4_ = uVar19;
          QVar3._28_4_ = uVar20;
          QVar3._32_4_ = uVar21;
          QVar3._36_4_ = in_stack_fffffffffffffdcc;
          QVar3.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = uVar22;
          QVar3.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _4_12_ = in_stack_fffffffffffffdd4;
          QPDFPageObjectHelper::copyAnnotations
                    (QVar3,pQVar7,(QPDFAcroFormDocumentHelper *)local_1b0,
                     (QPDFAcroFormDocumentHelper *)&local_1f8);
          QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_f0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_e0) {
            operator_delete(local_f0.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            local_e0[0] + 1);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
          pQVar7 = pQVar7 + 0x38;
        } while (pQVar7 != local_c8);
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_b8);
      QPDFWriter::QPDFWriter((QPDFWriter *)&local_1f8,(QPDF *)&stack0xfffffffffffffdd8,local_d0);
      QPDFWriter::setStaticID(SUB81(&local_1f8,0));
      QPDFWriter::write();
      if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
      }
      if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
      }
      if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
      }
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&local_148);
      QPDF::~QPDF(local_200);
      QPDF::~QPDF((QPDF *)&stack0xfffffffffffffdd8);
      return 0;
    }
  }
  else {
    usage();
  }
  auVar12 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,(in_RCX >> 3) * 0x6db6db6db6db6db7);
  if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&local_148);
  QPDF::~QPDF(local_200);
  QPDF::~QPDF((QPDF *)&stack0xfffffffffffffdd8);
  if (auVar12._8_4_ == 1) {
    plVar4 = (long *)__cxa_begin_catch(auVar12._0_8_);
    poVar5 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    pcVar6 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(2);
  }
  _Unwind_Resume(auVar12._0_8_);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }
    char const* infile = argv[1];
    char const* stampfile = argv[2];
    char const* outfile = argv[3];

    try {
        stamp_page(infile, stampfile, outfile);
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}